

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  char *digits;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t __len;
  char *pcVar9;
  ptrdiff_t _Num;
  bool bVar10;
  bool bVar11;
  
  sVar2 = *(size_t *)(this + 0x10);
  if (sVar2 != 0) {
    pcVar9 = *it;
    memmove(pcVar9,*(void **)(this + 8),sVar2);
    *it = pcVar9 + sVar2;
  }
  pcVar7 = *it;
  sVar2 = *(size_t *)(this + 0x20);
  pcVar9 = pcVar7;
  if (sVar2 != 0) {
    pcVar9 = pcVar7 + sVar2;
    memset(pcVar7,*(int *)(this + 0x18),sVar2);
  }
  *it = pcVar9;
  lVar3 = *(long *)(this + 0x28);
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(lVar3 + 8) + 8) == 'x') {
    pcVar5 = "0123456789abcdef";
  }
  else {
    pcVar5 = "0123456789ABCDEF";
  }
  pcVar7 = pcVar7 + sVar2 + (long)iVar1;
  uVar6 = *(ulong *)(lVar3 + 0x10);
  uVar8 = *(ulong *)(lVar3 + 0x18);
  do {
    pcVar7 = pcVar7 + -1;
    *pcVar7 = pcVar5[(uint)uVar6 & 0xf];
    bVar10 = 0xf < uVar6;
    bVar11 = uVar8 != 0;
    uVar4 = -uVar8;
    uVar6 = uVar8 << 0x3c | uVar6 >> 4;
    uVar8 = uVar8 >> 4;
  } while (bVar11 || uVar4 < bVar10);
  *it = pcVar9 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }